

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitStringTest_single_word_long_Test<char8_t>::TestBody
          (WordSplitStringTest_single_word_long_Test<char8_t> *this)

{
  char *pcVar1;
  int local_a0 [2];
  long *local_98;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_68;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> single_word;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  
  make_delim_long<char8_t,std::__cxx11::u8string>(&delim,8,'\0');
  std::__cxx11::u8string::u8string((u8string *)&local_68,&delim);
  make_word<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&single_word,&local_68,8);
  std::__cxx11::u8string::~u8string((u8string *)&local_68);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&split_result,&single_word,&delim);
  local_98 = (long *)((long)split_result.
                            super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)split_result.
                            super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_a0[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"split_result.size()","1",(unsigned_long *)&local_98,local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xe3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_98 = (long *)(split_result.
                      super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  local_a0[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"split_result[0].size()","8",(unsigned_long *)&local_98,local_a0)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xe4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&split_result);
  std::__cxx11::u8string::~u8string((u8string *)&single_word);
  std::__cxx11::u8string::~u8string((u8string *)&delim);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, single_word_long) {
	auto delim = make_delim_long<TypeParam>(8);
	std::basic_string<TypeParam> single_word = make_word<TypeParam>(delim);
	std::vector<decltype(single_word)> split_result = word_split(single_word, delim);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}